

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void lambert_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  array<vec<3UL,_int>,_3UL> pts;
  pointer pdVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  int j;
  size_t i;
  ulong iface;
  double dVar5;
  vector<double,_std::allocator<double>_> zbuffer;
  vec3f n;
  array<vec<3UL,_int>,_3UL> screen_coords;
  array<vec<3UL,_double>,_3UL> world_coords;
  vector<double,_std::allocator<double>_> local_128;
  TGAImage *local_108;
  vec3f local_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  int local_c8;
  vec<3UL,_double> local_c0;
  vec<3UL,_double> local_a8;
  vec3f local_90;
  vec<3UL,_double> local_78;
  vec<3UL,_double> vStack_60;
  vec<3UL,_double> local_48;
  
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108 = image;
  pdVar1 = (pointer)operator_new(0x2bf200);
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1 + 360000;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)pdVar1 + lVar3) = 0xffefffffffffffff;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x2bf200);
  iface = 0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar1;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  while( true ) {
    sVar2 = Model::nfaces(model);
    if (sVar2 <= iface) break;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_c8 = 0;
    local_48.x = 0.0;
    local_48.y = 0.0;
    vStack_60.y = 0.0;
    vStack_60.z = 0.0;
    local_78.z = 0.0;
    vStack_60.x = 0.0;
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_48.z = 0.0;
    lVar3 = 0;
    sVar2 = 0;
    do {
      Model::vert(&local_90,model,iface,sVar2);
      iVar4 = (int)local_90.z;
      *(ulong *)((long)&local_e8 + lVar3) =
           CONCAT44((int)((local_90.y + 1.0) * 600.0 * 0.5 + 0.5),
                    (int)((local_90.x + 1.0) * 600.0 * 0.5 + 0.5));
      *(int *)((long)&uStack_e0 + lVar3) = iVar4;
      Model::vert(&local_100,model,iface,sVar2);
      *(double *)((long)&local_78.z + lVar3 * 2) = local_100.z;
      *(double *)((long)&local_78.x + lVar3 * 2) = local_100.x;
      *(double *)((long)&local_78.y + lVar3 * 2) = local_100.y;
      sVar2 = sVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (sVar2 != 3);
    operator-(&local_a8,&local_48,&local_78);
    operator-(&local_c0,&vStack_60,&local_78);
    local_100.x = local_a8.y * local_c0.z - local_c0.y * local_a8.z;
    local_100.y = local_a8.z * local_c0.x - local_c0.z * local_a8.x;
    local_100.z = local_a8.x * local_c0.y - local_c0.x * local_a8.y;
    vec<3UL,_double>::normalize(&local_100);
    dVar5 = dot<3ul,double>(&local_100,&light_dir);
    if (0.0 < dVar5) {
      pts._M_elems[0].z = (undefined4)uStack_e0;
      pts._M_elems[1].x = uStack_e0._4_4_;
      pts._M_elems[0].x = (undefined4)local_e8;
      pts._M_elems[0].y = local_e8._4_4_;
      pts._M_elems[1].y = (undefined4)local_d8;
      pts._M_elems[1].z = local_d8._4_4_;
      pts._M_elems[2].x = (undefined4)uStack_d0;
      pts._M_elems[2].y = uStack_d0._4_4_;
      pts._M_elems[2].z = local_c8;
      triangle(pts,&local_128,local_108,
               (TGAColor)((uint5)((int)(dVar5 * 255.0) & 0xff) * 0x10101 | 0x4ff000000));
    }
    iface = iface + 1;
  }
  operator_delete(pdVar1,0x2bf200);
  return;
}

Assistant:

void lambert_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> screen_coords;
        std::array<vec3f, 3> world_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = world2screen(model.vert(i, j));
            world_coords[j] = model.vert(i, j);
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);
        if (intensity > 0) {
            triangle(screen_coords, zbuffer, image,
                     TGAColor(static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255), 255));
        }
    }
}